

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# System.cpp
# Opt level: O0

string * nite::getCWD_abi_cxx11_(void)

{
  string *in_RDI;
  allocator local_1019;
  char local_1018 [8];
  char CurrentPath [4096];
  
  getcwd(local_1018,0x1000);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,local_1018,&local_1019);
  std::allocator<char>::~allocator((allocator<char> *)&local_1019);
  return in_RDI;
}

Assistant:

String nite::getCWD(){
	char CurrentPath[FILENAME_MAX];
	CWD(CurrentPath, sizeof(CurrentPath));
	return CurrentPath;
}